

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall slang::parsing::Lexer::scanLineComment(Lexer *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  TriviaKind kind;
  char *pcVar4;
  
  bVar2 = tryApplyCommentHandler(this);
  if (bVar2) {
    kind = DisabledText;
LAB_0020d72f:
    addTrivia(this,kind);
    return;
  }
  do {
    bVar2 = false;
    while( true ) {
      pcVar4 = this->sourceBuffer;
      cVar1 = *pcVar4;
      if (-1 < cVar1) break;
      bVar3 = scanUTF8Char(this,bVar2);
      bVar2 = (bool)(bVar2 | !bVar3);
    }
    kind = LineComment;
    if (cVar1 == '\0') {
      if (this->sourceEnd + -1 <= pcVar4) goto LAB_0020d72f;
      this->errorCount = this->errorCount + 1;
      addDiag(this,(DiagCode)0x50002,(long)pcVar4 - (long)this->originalBegin);
      pcVar4 = this->sourceBuffer;
    }
    else if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0020d72f;
    this->sourceBuffer = pcVar4 + 1;
  } while( true );
}

Assistant:

void Lexer::scanLineComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            if (isNewline(c))
                break;

            sawUTF8Error = false;
            if (c == '\0') {
                if (reallyAtEnd())
                    break;

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
            }
            advance();
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::LineComment);
}